

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::SetRanges
          (CharSet<char16_t> *this,ArenaAllocator *allocator,int numSortedPairs,Char *sortedPairs)

{
  code *pcVar1;
  bool bVar2;
  Char lc;
  undefined4 *puVar3;
  Char hc;
  long lVar4;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  lVar4 = 0;
  do {
    if (numSortedPairs * 2 <= lVar4) {
      return;
    }
    if ((lVar4 != 0) && ((ushort)sortedPairs[lVar4] <= (ushort)sortedPairs[lVar4 + -1])) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x46b,"(i == 0 || sortedPairs[i-1] < sortedPairs[i])",
                         "i == 0 || sortedPairs[i-1] < sortedPairs[i]");
      if (!bVar2) goto LAB_00cd93e5;
      *puVar3 = 0;
    }
    lc = sortedPairs[lVar4];
    hc = sortedPairs[lVar4 + 1];
    if ((ushort)hc < (ushort)lc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x46c,"(sortedPairs[i] <= sortedPairs[i+1])",
                         "sortedPairs[i] <= sortedPairs[i+1]");
      if (!bVar2) {
LAB_00cd93e5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      lc = sortedPairs[lVar4];
      hc = sortedPairs[lVar4 + 1];
    }
    SetRange(this,allocator,lc,hc);
    lVar4 = lVar4 + 2;
  } while( true );
}

Assistant:

void CharSet<char16>::SetRanges(ArenaAllocator* allocator, int numSortedPairs, const Char* sortedPairs)
    {
        for (int i = 0; i < numSortedPairs * 2; i += 2)
        {
            Assert(i == 0 || sortedPairs[i-1] < sortedPairs[i]);
            Assert(sortedPairs[i] <= sortedPairs[i+1]);
            SetRange(allocator, sortedPairs[i], sortedPairs[i+1]);
        }
    }